

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall CLIntercept::logCLInfo(CLIntercept *this)

{
  cl_uint cVar1;
  int iVar2;
  cl_int cVar3;
  cl_platform_id *pp_Var4;
  cl_device_id *pp_Var5;
  undefined8 uVar6;
  pthread_mutex_t *__mutex;
  ulong uVar7;
  ulong uVar8;
  float __x;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double __x_00;
  double dVar9;
  double extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  cl_uint numDevices;
  cl_uint numPlatforms;
  cl_uint local_68;
  cl_uint local_64;
  pthread_mutex_t *local_60;
  cl_platform_id *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (this->m_LoggedCLInfo == false) {
    __mutex = (pthread_mutex_t *)&this->m_Mutex;
    iVar2 = pthread_mutex_lock(__mutex);
    if (iVar2 != 0) {
      uVar6 = std::__throw_system_error(iVar2);
      pthread_mutex_unlock(local_60);
      _Unwind_Resume(uVar6);
    }
    if (this->m_LoggedCLInfo == false) {
      this->m_LoggedCLInfo = true;
      local_64 = 0;
      cVar3 = (*(this->m_Dispatch).clGetPlatformIDs)(0,(cl_platform_id *)0x0,&local_64);
      if (local_64 != 0 && cVar3 == 0) {
        logf(this,__x);
        cVar1 = local_64;
        local_60 = __mutex;
        pp_Var4 = (cl_platform_id *)operator_new__((ulong)local_64 * 8);
        cVar3 = (*(this->m_Dispatch).clGetPlatformIDs)(cVar1,pp_Var4,(cl_uint *)0x0);
        if (local_64 != 0) {
          uVar8 = 0;
          uVar6 = extraout_XMM0_Qa;
          local_58 = pp_Var4;
          do {
            if (cVar3 == 0) {
              logf(this,(float)uVar6);
              logPlatformInfo(this,pp_Var4[uVar8]);
              local_68 = 0;
              cVar3 = (*(this->m_Dispatch).clGetDeviceIDs)
                                (pp_Var4[uVar8],0xffffffff,0,(cl_device_id *)0x0,&local_68);
              uVar6 = extraout_XMM0_Qa_00;
            }
            else {
              local_68 = 0;
            }
            if (local_68 != 0 && cVar3 == 0) {
              logf(this,(float)uVar6);
              cVar1 = local_68;
              pp_Var5 = (cl_device_id *)operator_new__((ulong)local_68 * 8);
              cVar3 = (*(this->m_Dispatch).clGetDeviceIDs)
                                (pp_Var4[uVar8],0xffffffff,cVar1,pp_Var5,(cl_uint *)0x0);
              if (local_68 != 0) {
                uVar7 = 0;
                dVar9 = extraout_XMM0_Qa_01;
                do {
                  if (cVar3 == 0) {
                    logf(this,SUB84(dVar9,0));
                    logDeviceInfo(this,pp_Var5[uVar7]);
                    local_50[0] = local_40;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"\n","");
                    dVar9 = log(this,__x_00);
                    if (local_50[0] != local_40) {
                      operator_delete(local_50[0]);
                      dVar9 = extraout_XMM0_Qa_02;
                    }
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar7 < local_68);
              }
              operator_delete__(pp_Var5);
              pp_Var4 = local_58;
              uVar6 = extraout_XMM0_Qa_03;
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 < local_64);
        }
        operator_delete__(pp_Var4);
        __mutex = local_60;
      }
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

void CLIntercept::logCLInfo()
{
    if( m_LoggedCLInfo == false )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        if( m_LoggedCLInfo == false )
        {
            m_LoggedCLInfo = true;

            cl_int  errorCode = CL_SUCCESS;
            cl_uint numPlatforms = 0;

            if( errorCode == CL_SUCCESS )
            {
                errorCode = dispatch().clGetPlatformIDs(
                    0,
                    NULL,
                    &numPlatforms );
            }

            if( errorCode == CL_SUCCESS && numPlatforms != 0 )
            {
                logf( "\nEnumerated %u platform%s.\n\n",
                    numPlatforms,
                    numPlatforms > 1 ? "s" : "" );

                cl_platform_id* platforms = new cl_platform_id[numPlatforms];
                if( platforms )
                {
                    errorCode = dispatch().clGetPlatformIDs(
                        numPlatforms,
                        platforms,
                        NULL );
                }
                else
                {
                    errorCode = CL_OUT_OF_HOST_MEMORY;
                }

                for( cl_uint p = 0; p < numPlatforms; p++ )
                {
                    if( errorCode == CL_SUCCESS )
                    {
                        logf( "Platform %u:\n", p );
                        logPlatformInfo( platforms[p] );
                    }

                    cl_uint numDevices = 0;

                    if( errorCode == CL_SUCCESS )
                    {
                        errorCode = dispatch().clGetDeviceIDs(
                            platforms[p],
                            CL_DEVICE_TYPE_ALL,
                            0,
                            NULL,
                            &numDevices );
                    }
                    if( errorCode == CL_SUCCESS && numDevices != 0 )
                    {
                        logf( "\tPlatform has %u device%s.\n\n",
                            numDevices,
                            numDevices > 1 ? "s" : "" );

                        cl_device_id*   devices = new cl_device_id[numDevices];
                        if( devices )
                        {
                            errorCode = dispatch().clGetDeviceIDs(
                                platforms[p],
                                CL_DEVICE_TYPE_ALL,
                                numDevices,
                                devices,
                                NULL );
                        }
                        else
                        {
                            errorCode = CL_OUT_OF_HOST_MEMORY;
                        }

                        for( cl_uint d = 0; d < numDevices; d++ )
                        {
                            if( errorCode == CL_SUCCESS )
                            {
                                logf( "Device %u:\n", d );
                                logDeviceInfo( devices[d] );
                                log( "\n" );
                            }
                        }

                        delete [] devices;
                    }
                }

                delete [] platforms;
            }
        }
    }
}